

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.h
# Opt level: O3

void arangodb::velocypack::Collection::keys
               (Slice slice,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *result)

{
  string_view sVar1;
  ObjectIterator it;
  uint8_t *local_50;
  size_t local_48;
  ObjectIterator local_40;
  
  ObjectIterator::ObjectIterator(&local_40,slice,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(result,local_40._size);
  if (local_40._position != local_40._size) {
    do {
      local_50 = (uint8_t *)ObjectIterator::key(&local_40,true);
      sVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::stringView
                        ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                         &local_50);
      local_50 = (uint8_t *)sVar1._M_str;
      local_48 = sVar1._M_len;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*,unsigned_long>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,
                 (char **)&local_50,&local_48);
      ObjectIterator::next(&local_40);
    } while (local_40._position != local_40._size);
  }
  return;
}

Assistant:

static void keys(Slice slice, std::vector<std::string>& result) {
    // pre-allocate result vector
    ObjectIterator it(slice, /*useSequentialIteration*/ false);
    result.reserve(checkOverflow(it.size()));

    while (it.valid()) {
      std::string_view sv = it.key(true).stringView();
      result.emplace_back(sv.data(), sv.size());
      it.next();
    }
  }